

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>
::~Matrix(Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>
          *this)

{
  Column_container *this_00;
  Column_settings *pCVar1;
  pool<boost::default_user_allocator_malloc_free> *this_01;
  
  pCVar1 = this->colSettings_;
  this_00 = &(this->matrix_).matrix_;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&this_00->_M_h);
  (this->matrix_).nextInsertIndex_ = 0;
  (this->matrix_).colSettings_ = pCVar1;
  this_01 = (pool<boost::default_user_allocator_malloc_free> *)this->colSettings_;
  if (this_01 != (pool<boost::default_user_allocator_malloc_free> *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory(this_01);
  }
  operator_delete(this_01,0x38);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&this_00->_M_h);
  Matrix_row_access<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>_>_>_>,_std::map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true>_>_>_>_>_>_>_>,_true,_unsigned_int>
  ::~Matrix_row_access(&(this->matrix_).super_Matrix_row_access_option);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->matrix_).
                 super_template_Base_swap_option<Base_matrix<Matrix<Base_options_with_row_access<true,_(Column_types)7,_true,_false,_true,_true>_>_>_>
                 .rowToIndex_._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&this->matrix_);
  return;
}

Assistant:

inline Matrix<PersistenceMatrixOptions>::~Matrix()
{
  matrix_.reset(colSettings_);
  delete colSettings_;
}